

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

int __thiscall Min2<0>::checkSatisfied(Min2<0> *this)

{
  char cVar1;
  IntView<0> *this_00;
  IntView<0> *pIVar2;
  int64_t iVar3;
  int64_t iVar4;
  long in_RDI;
  Tchar *unaff_retaddr;
  IntView<0> *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffffc;
  char o;
  
  o = (char)((uint)in_stack_fffffffffffffffc >> 0x18);
  cVar1 = Tchar::operator_cast_to_char((Tchar *)(in_RDI + 0x10));
  if (cVar1 != '\0') {
    return 1;
  }
  this_00 = (IntView<0> *)IntView<0>::getMin(in_stack_ffffffffffffffe0);
  pIVar2 = (IntView<0> *)IntView<0>::getMax(this_00);
  if (this_00 != pIVar2) {
    iVar3 = IntView<0>::getMin(this_00);
    iVar4 = IntView<0>::getMax(this_00);
    if (iVar3 != iVar4) {
      return 3;
    }
  }
  Tchar::operator=(unaff_retaddr,o);
  return 3;
}

Assistant:

int checkSatisfied() override {
		if (satisfied) {
			return 1;
		}
		if (z.getMin() == x.getMax() || z.getMin() == y.getMax()) {
			satisfied = true;
		}
		return 3;
	}